

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::OnFunctionSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index func_index)

{
  allocator<char> local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [40];
  Index local_28;
  
  local_60._M_str = name._M_str;
  local_60._M_len = name._M_len;
  if (local_60._M_len != 0) {
    SetFunctionName(this,func_index,name);
  }
  local_50._0_4_ = Function;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_50 + 8),&local_60,&local_61);
  local_28 = func_index;
  ObjdumpSymbol::operator=
            ((((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab).
             super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
             super__Vector_impl_data._M_start + index,(ObjdumpSymbol *)local_50);
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result OnFunctionSymbol(Index index,
                          uint32_t flags,
                          std::string_view name,
                          Index func_index) override {
    if (!name.empty()) {
      SetFunctionName(func_index, name);
    }
    objdump_state_->symtab[index] = {SymbolType::Function, std::string(name),
                                     func_index};
    return Result::Ok;
  }